

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# namingConventions.cpp
# Opt level: O3

Pda * namingConventions::makeNamePda(string *name)

{
  Node *pNVar1;
  Node *pNVar2;
  byte bVar3;
  byte bVar4;
  char cVar5;
  char cVar6;
  Pda *this;
  long *plVar7;
  vector<Tjen::Node_*,_std::allocator<Tjen::Node_*>_> *pvVar8;
  vector<Tjen::Node_*,_std::allocator<Tjen::Node_*>_> *pvVar9;
  uint uVar10;
  long *plVar11;
  ulong uVar12;
  uint uVar13;
  long lVar14;
  ulong uVar15;
  bool bVar16;
  string alphabeth;
  string __str;
  string nodename;
  undefined1 *local_198;
  long local_190;
  undefined1 local_188;
  undefined7 uStack_187;
  string *local_178;
  long *local_170;
  uint local_168;
  long local_160 [2];
  long *local_150;
  long local_148;
  long local_140;
  long lStack_138;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  this = (Pda *)operator_new(0x90);
  Pda::Pda(this);
  local_198 = &local_188;
  local_190 = 0;
  local_188 = 0;
  local_178 = name;
  if (name->_M_string_length != 0xffffffffffffffff) {
    uVar15 = 0;
    do {
      cVar6 = '\x01';
      uVar13 = (uint)uVar15;
      if (9 < uVar13) {
        uVar12 = uVar15;
        cVar5 = '\x04';
        do {
          cVar6 = cVar5;
          uVar10 = (uint)uVar12;
          if (uVar10 < 100) {
            cVar6 = cVar6 + -2;
            goto LAB_0010610f;
          }
          if (uVar10 < 1000) {
            cVar6 = cVar6 + -1;
            goto LAB_0010610f;
          }
          if (uVar10 < 10000) goto LAB_0010610f;
          uVar12 = uVar12 / 10000;
          cVar5 = cVar6 + '\x04';
        } while (99999 < uVar10);
        cVar6 = cVar6 + '\x01';
      }
LAB_0010610f:
      local_170 = local_160;
      std::__cxx11::string::_M_construct((ulong)&local_170,cVar6);
      std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_170,local_168,uVar13);
      plVar7 = (long *)std::__cxx11::string::replace((ulong)&local_170,0,(char *)0x0,0x13c060);
      plVar11 = plVar7 + 2;
      if ((long *)*plVar7 == plVar11) {
        local_140 = *plVar11;
        lStack_138 = plVar7[3];
        local_150 = &local_140;
      }
      else {
        local_140 = *plVar11;
        local_150 = (long *)*plVar7;
      }
      local_148 = plVar7[1];
      *plVar7 = (long)plVar11;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      if (local_170 != local_160) {
        operator_delete(local_170,local_160[0] + 1);
      }
      local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_130,local_150,local_148 + (long)local_150);
      Pda::addNode(this,&local_130,uVar13 == 0,local_178->_M_string_length == uVar15);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_130._M_dataplus._M_p != &local_130.field_2) {
        operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
      }
      if (local_190 == 0) {
LAB_0010624f:
        std::__cxx11::string::push_back((char)&local_198);
      }
      else {
        lVar14 = 0;
        bVar4 = 0;
        do {
          bVar3 = bVar4;
          bVar16 = local_198[lVar14] == (local_178->_M_dataplus)._M_p[uVar15];
          lVar14 = lVar14 + 1;
          bVar4 = bVar3 | bVar16;
        } while (local_190 != lVar14);
        if (!(bool)(bVar3 | bVar16)) goto LAB_0010624f;
      }
      if (local_150 != &local_140) {
        operator_delete(local_150,local_140 + 1);
      }
      uVar15 = (ulong)(uVar13 + 1);
    } while (uVar15 < local_178->_M_string_length + 1);
  }
  uVar13 = 1;
  while( true ) {
    pvVar8 = Pda::getAllNodes(this);
    uVar15 = (ulong)(uVar13 - 1);
    if (((long)(pvVar8->super__Vector_base<Tjen::Node_*,_std::allocator<Tjen::Node_*>_>)._M_impl.
               super__Vector_impl_data._M_finish -
         (long)(pvVar8->super__Vector_base<Tjen::Node_*,_std::allocator<Tjen::Node_*>_>)._M_impl.
               super__Vector_impl_data._M_start >> 3) - 1U <= uVar15) break;
    pvVar8 = Pda::getAllNodes(this);
    pNVar1 = (pvVar8->super__Vector_base<Tjen::Node_*,_std::allocator<Tjen::Node_*>_>)._M_impl.
             super__Vector_impl_data._M_start[uVar15];
    pvVar8 = Pda::getAllNodes(this);
    pNVar2 = (pvVar8->super__Vector_base<Tjen::Node_*,_std::allocator<Tjen::Node_*>_>)._M_impl.
             super__Vector_impl_data._M_start[uVar13];
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50," ","");
    Pda::addFunct(this,pNVar1,pNVar2,' ',&local_50,(local_178->_M_dataplus)._M_p[uVar15]);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    uVar13 = uVar13 + 1;
  }
  pvVar8 = Pda::getAllNodes(this);
  pNVar1 = *(pvVar8->super__Vector_base<Tjen::Node_*,_std::allocator<Tjen::Node_*>_>)._M_impl.
            super__Vector_impl_data._M_start;
  pvVar8 = Pda::getAllNodes(this);
  pNVar2 = *(pvVar8->super__Vector_base<Tjen::Node_*,_std::allocator<Tjen::Node_*>_>)._M_impl.
            super__Vector_impl_data._M_start;
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70," ","");
  Pda::addFunct(this,pNVar1,pNVar2,' ',&local_70,' ');
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  pvVar8 = Pda::getAllNodes(this);
  pvVar9 = Pda::getAllNodes(this);
  pNVar1 = *(Node **)((long)(pvVar9->super__Vector_base<Tjen::Node_*,_std::allocator<Tjen::Node_*>_>
                            )._M_impl.super__Vector_impl_data._M_finish +
                     (long)(pvVar8->super__Vector_base<Tjen::Node_*,_std::allocator<Tjen::Node_*>_>)
                           ._M_impl.super__Vector_impl_data._M_start +
                     (-8 - (long)(pvVar9->
                                 super__Vector_base<Tjen::Node_*,_std::allocator<Tjen::Node_*>_>).
                                 _M_impl.super__Vector_impl_data._M_start));
  pvVar8 = Pda::getAllNodes(this);
  pvVar9 = Pda::getAllNodes(this);
  pNVar2 = *(Node **)((long)(pvVar9->super__Vector_base<Tjen::Node_*,_std::allocator<Tjen::Node_*>_>
                            )._M_impl.super__Vector_impl_data._M_finish +
                     (long)(pvVar8->super__Vector_base<Tjen::Node_*,_std::allocator<Tjen::Node_*>_>)
                           ._M_impl.super__Vector_impl_data._M_start +
                     (-8 - (long)(pvVar9->
                                 super__Vector_base<Tjen::Node_*,_std::allocator<Tjen::Node_*>_>).
                                 _M_impl.super__Vector_impl_data._M_start));
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90," ","");
  Pda::addFunct(this,pNVar1,pNVar2,' ',&local_90,' ');
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  pvVar8 = Pda::getAllNodes(this);
  pvVar9 = Pda::getAllNodes(this);
  pNVar1 = *(Node **)((long)(pvVar9->super__Vector_base<Tjen::Node_*,_std::allocator<Tjen::Node_*>_>
                            )._M_impl.super__Vector_impl_data._M_finish +
                     (long)(pvVar8->super__Vector_base<Tjen::Node_*,_std::allocator<Tjen::Node_*>_>)
                           ._M_impl.super__Vector_impl_data._M_start +
                     (-8 - (long)(pvVar9->
                                 super__Vector_base<Tjen::Node_*,_std::allocator<Tjen::Node_*>_>).
                                 _M_impl.super__Vector_impl_data._M_start));
  pvVar8 = Pda::getAllNodes(this);
  pvVar9 = Pda::getAllNodes(this);
  pNVar2 = *(Node **)((long)(pvVar9->super__Vector_base<Tjen::Node_*,_std::allocator<Tjen::Node_*>_>
                            )._M_impl.super__Vector_impl_data._M_finish +
                     (long)(pvVar8->super__Vector_base<Tjen::Node_*,_std::allocator<Tjen::Node_*>_>)
                           ._M_impl.super__Vector_impl_data._M_start +
                     (-8 - (long)(pvVar9->
                                 super__Vector_base<Tjen::Node_*,_std::allocator<Tjen::Node_*>_>).
                                 _M_impl.super__Vector_impl_data._M_start));
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0," ","");
  Pda::addFunct(this,pNVar1,pNVar2,' ',&local_b0,'(');
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  pvVar8 = Pda::getAllNodes(this);
  pvVar9 = Pda::getAllNodes(this);
  pNVar1 = *(Node **)((long)(pvVar9->super__Vector_base<Tjen::Node_*,_std::allocator<Tjen::Node_*>_>
                            )._M_impl.super__Vector_impl_data._M_finish +
                     (long)(pvVar8->super__Vector_base<Tjen::Node_*,_std::allocator<Tjen::Node_*>_>)
                           ._M_impl.super__Vector_impl_data._M_start +
                     (-8 - (long)(pvVar9->
                                 super__Vector_base<Tjen::Node_*,_std::allocator<Tjen::Node_*>_>).
                                 _M_impl.super__Vector_impl_data._M_start));
  pvVar8 = Pda::getAllNodes(this);
  pvVar9 = Pda::getAllNodes(this);
  pNVar2 = *(Node **)((long)(pvVar9->super__Vector_base<Tjen::Node_*,_std::allocator<Tjen::Node_*>_>
                            )._M_impl.super__Vector_impl_data._M_finish +
                     (long)(pvVar8->super__Vector_base<Tjen::Node_*,_std::allocator<Tjen::Node_*>_>)
                           ._M_impl.super__Vector_impl_data._M_start +
                     (-8 - (long)(pvVar9->
                                 super__Vector_base<Tjen::Node_*,_std::allocator<Tjen::Node_*>_>).
                                 _M_impl.super__Vector_impl_data._M_start));
  local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0," ","");
  Pda::addFunct(this,pNVar1,pNVar2,' ',&local_d0,')');
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
  }
  local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
  std::__cxx11::string::_M_construct<char*>((string *)&local_f0,local_198,local_198 + local_190);
  Pda::setAlphabet(this,&local_f0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
    operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
  }
  local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
  std::__cxx11::string::_M_construct<char*>((string *)&local_110,local_198,local_198 + local_190);
  Pda::setStackAlphabet(this,&local_110);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110._M_dataplus._M_p != &local_110.field_2) {
    operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
  }
  if (local_198 != &local_188) {
    operator_delete(local_198,CONCAT71(uStack_187,local_188) + 1);
  }
  return this;
}

Assistant:

Pda *namingConventions::makeNamePda(std::string &name) {
    Pda *p = new Pda();
    std::string alphabeth;
    for (unsigned int c = 0; c < name.size() + 1; ++c) {
        std::string nodename = "q" + std::to_string(c);
        p->addNode(nodename, c == 0, c == name.size());
        bool present = false;
        for (char &ch: alphabeth) {
            if (ch == name[c]) {
                present = true;
            }
        }
        if (!present) {
            alphabeth += name[c];
        }
    }
    for (unsigned int i = 0; i < p->getAllNodes().size() - 1; ++i) {
        p->addFunct(p->getAllNodes()[i], p->getAllNodes()[i + 1], ' ', " ", name[i]);
    }
    p->addFunct(p->getAllNodes()[0], p->getAllNodes()[0], ' ', " ", ' ');
    p->addFunct(p->getAllNodes()[p->getAllNodes().size() - 1], p->getAllNodes()[p->getAllNodes().size() - 1], ' ',
                " ", ' ');
  p->addFunct(p->getAllNodes()[p->getAllNodes().size() - 1], p->getAllNodes()[p->getAllNodes().size() - 1], ' ',
              " ", '(');
  p->addFunct(p->getAllNodes()[p->getAllNodes().size() - 1], p->getAllNodes()[p->getAllNodes().size() - 1], ' ',
              " ", ')');


    p->setAlphabet(alphabeth);
    p->setStackAlphabet(alphabeth);
    return p;
}